

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscOutboundPacketStream.cpp
# Opt level: O0

OutboundPacketStream * __thiscall
osc::OutboundPacketStream::operator<<(OutboundPacketStream *this,double rhs)

{
  char *pcVar1;
  char local_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  anon_union_8_2_94730044 u;
  double rhs_local;
  OutboundPacketStream *this_local;
  
  CheckForAvailableArgumentSpace(this,8);
  pcVar1 = this->typeTagsCurrent_;
  this->typeTagsCurrent_ = pcVar1 + -1;
  pcVar1[-1] = 'd';
  local_20 = SUB81(rhs,0);
  this->argumentCurrent_[7] = local_20;
  cStack_1f = (char)((ulong)rhs >> 8);
  this->argumentCurrent_[6] = cStack_1f;
  cStack_1e = (char)((ulong)rhs >> 0x10);
  this->argumentCurrent_[5] = cStack_1e;
  cStack_1d = (char)((ulong)rhs >> 0x18);
  this->argumentCurrent_[4] = cStack_1d;
  cStack_1c = (char)((ulong)rhs >> 0x20);
  this->argumentCurrent_[3] = cStack_1c;
  cStack_1b = (char)((ulong)rhs >> 0x28);
  this->argumentCurrent_[2] = cStack_1b;
  cStack_1a = (char)((ulong)rhs >> 0x30);
  this->argumentCurrent_[1] = cStack_1a;
  cStack_19 = (char)((ulong)rhs >> 0x38);
  *this->argumentCurrent_ = cStack_19;
  this->argumentCurrent_ = this->argumentCurrent_ + 8;
  return this;
}

Assistant:

OutboundPacketStream& OutboundPacketStream::operator<<( double rhs )
{
    CheckForAvailableArgumentSpace(8);

    *(--typeTagsCurrent_) = DOUBLE_TYPE_TAG;

#ifdef OSC_HOST_LITTLE_ENDIAN
    union{
        double f;
        char c[8];
    } u;

    u.f = rhs;

    argumentCurrent_[7] = u.c[0];
    argumentCurrent_[6] = u.c[1];
    argumentCurrent_[5] = u.c[2];
    argumentCurrent_[4] = u.c[3];
    argumentCurrent_[3] = u.c[4];
    argumentCurrent_[2] = u.c[5];
    argumentCurrent_[1] = u.c[6];
    argumentCurrent_[0] = u.c[7];
#else
    *reinterpret_cast<double*>(argumentCurrent_) = rhs;
#endif

    argumentCurrent_ += 8;

    return *this;
}